

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

_Bool file_stdio_fclose(ALLEGRO_FILE *f)

{
  int iVar1;
  USERDATA *ptr;
  int *piVar2;
  _Bool _Var3;
  
  ptr = get_userdata(f);
  _Var3 = true;
  if ((FILE *)ptr->fp != (FILE *)0x0) {
    iVar1 = fclose((FILE *)ptr->fp);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      al_set_errno(*piVar2);
      _Var3 = false;
    }
  }
  al_free_with_context
            (ptr,0x9f,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
             ,"file_stdio_fclose");
  return _Var3;
}

Assistant:

static bool file_stdio_fclose(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);
   bool ret;

   if (userdata->fp == NULL) {
      /* This can happen in the middle of al_fopen_fd. */
      ret = true;
   }
   else if (fclose(userdata->fp) == 0) {
      ret = true;
   }
   else {
      al_set_errno(errno);
      ret = false;
   }

   al_free(userdata);

   return ret;
}